

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

void free_path(PATHFIND_DATA *path)

{
  long lVar1;
  
  if ((((path->dir_to[0] != (PATHFIND_DATA *)0x0) || (path->dir_to[1] != (PATHFIND_DATA *)0x0)) ||
      (path->dir_to[2] != (PATHFIND_DATA *)0x0)) ||
     (((path->dir_to[3] != (PATHFIND_DATA *)0x0 || (path->dir_to[4] != (PATHFIND_DATA *)0x0)) ||
      (path->dir_to[5] != (PATHFIND_DATA *)0x0)))) {
    lVar1 = 4;
    do {
      if (path->dir_to[lVar1 + -4] != (PATHFIND_DATA *)0x0) {
        free_path(path->dir_to[lVar1 + -4]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 10);
  }
  if (path != (PATHFIND_DATA *)0x0) {
    operator_delete(path,0x50);
    return;
  }
  return;
}

Assistant:

void free_path(PATHFIND_DATA *path)
{
	if (!path->dir_to[Directions::North]
		&& !path->dir_to[Directions::East]
		&& !path->dir_to[Directions::South]
		&& !path->dir_to[Directions::West]
		&& !path->dir_to[Directions::Up]
		&& !path->dir_to[Directions::Down])
	{
		delete path;
	}
	else
	{
		for (int i = 0; i < 6; i++)
		{
			if (path->dir_to[i])
				free_path(path->dir_to[i]);
		}

		delete path;
	}
}